

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float tcu::sampleCubeSeamlessLinearCompare
                (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,Sampler *sampler,
                float ref,float s,float t)

{
  bool isFixedPoint;
  int i_1;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int i;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  CubeFaceIntCoords CVar9;
  float local_b0;
  float sampleRes [4];
  bool hasBothCoordsOutOfBounds [4];
  IVec2 baseSampleCoords [4];
  CubeFace local_40;
  undefined8 local_3c;
  
  iVar2 = (*faceAccesses)[0].m_size.m_data[0];
  local_b0 = t;
  if (sampler->normalizedCoords == true) {
    s = unnormalize(sampler->wrapS,s,iVar2);
    local_b0 = unnormalize(sampler->wrapT,t,iVar2);
  }
  fVar6 = floorf(s + -0.5);
  iVar4 = (int)fVar6;
  fVar7 = floorf(local_b0 + -0.5);
  baseSampleCoords[0].m_data[1] = (int)fVar7;
  baseSampleCoords[0].m_data[0] = iVar4;
  baseSampleCoords[1].m_data[0] = iVar4 + 1;
  baseSampleCoords[1].m_data[1] = baseSampleCoords[0].m_data[1];
  baseSampleCoords[2].m_data[0] = iVar4;
  baseSampleCoords[2].m_data[1] = baseSampleCoords[0].m_data[1] + 1;
  baseSampleCoords[3].m_data[0] = iVar4 + 1;
  baseSampleCoords[3].m_data[1] = baseSampleCoords[0].m_data[1] + 1;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    local_40 = baseFace;
    local_3c = *(undefined8 *)baseSampleCoords[lVar5].m_data;
    CVar9 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_40,iVar2);
    uVar3 = CVar9._0_8_ & 0xffffffff;
    hasBothCoordsOutOfBounds[lVar5] = uVar3 == 6;
    if (uVar3 != 6) {
      isFixedPoint = isFixedPointDepthTextureFormat(&(*faceAccesses)[uVar3].m_format);
      ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&local_40,(int)&(*faceAccesses)[uVar3].m_format,CVar9.s,
                 CVar9.t);
      fVar8 = execCompare((Vec4 *)&local_40,sampler->compare,sampler->compareChannel,ref,
                          isFixedPoint);
      sampleRes[lVar5] = fVar8;
    }
  }
  uVar3 = 0xffffffffffffffff;
  for (uVar1 = 0; uVar1 != 4; uVar1 = uVar1 + 1) {
    if (hasBothCoordsOutOfBounds[uVar1] != false) {
      uVar3 = uVar1;
    }
    uVar3 = uVar3 & 0xffffffff;
  }
  iVar2 = (int)uVar3;
  if (iVar2 != -1) {
    sampleRes[iVar2] = 0.0;
    fVar8 = 0.0;
    for (uVar1 = 0; uVar1 != 4; uVar1 = uVar1 + 1) {
      if ((uVar3 & 0xffffffff) != uVar1) {
        fVar8 = fVar8 + sampleRes[uVar1];
        sampleRes[iVar2] = fVar8;
      }
    }
    sampleRes[iVar2] = fVar8 * 0.33333334;
  }
  fVar6 = (s + -0.5) - fVar6;
  fVar7 = (local_b0 + -0.5) - fVar7;
  return fVar6 * sampleRes[3] * fVar7 +
         (1.0 - fVar6) * sampleRes[2] * fVar7 +
         (1.0 - fVar7) * sampleRes[0] * (1.0 - fVar6) + sampleRes[1] * fVar6 * (1.0 - fVar7);
}

Assistant:

static float sampleCubeSeamlessLinearCompare (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, const Sampler& sampler, float ref, float s, float t)
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());

	int		size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float	u		= s;
	float	v		= t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, size);
		v = unnormalize(sampler.wrapT, t, size);
	}

	int			x0						= deFloorFloatToInt32(u-0.5f);
	int			x1						= x0+1;
	int			y0						= deFloorFloatToInt32(v-0.5f);
	int			y1						= y0+1;
	IVec2		baseSampleCoords[4]		=
	{
		IVec2(x0, y0),
		IVec2(x1, y0),
		IVec2(x0, y1),
		IVec2(x1, y1)
	};
	float		sampleRes[4];
	bool		hasBothCoordsOutOfBounds[4]; //!< Whether correctCubeFace() returns CUBEFACE_LAST, i.e. both u and v are out of bounds.

	// Find correct faces and coordinates for out-of-bounds sample coordinates.

	for (int i = 0; i < 4; i++)
	{
		CubeFaceIntCoords coords = remapCubeEdgeCoords(CubeFaceIntCoords(baseFace, baseSampleCoords[i]), size);
		hasBothCoordsOutOfBounds[i] = coords.face == CUBEFACE_LAST;

		if (!hasBothCoordsOutOfBounds[i])
		{
			const bool isFixedPointDepth = isFixedPointDepthTextureFormat(faceAccesses[coords.face].getFormat());

			sampleRes[i] = execCompare(faceAccesses[coords.face].getPixel(coords.s, coords.t), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		}
	}

	// If a sample was out of bounds in both u and v, we get its color from the average of the three other samples.
	// \note This averaging behavior is not required by the GLES3 spec (though it is recommended). GLES3 spec only
	//		 requires that if the three other samples all have the same color, then the doubly-out-of-bounds sample
	//		 must have this color as well.

	{
		int bothOutOfBoundsNdx = -1;
		for (int i = 0; i < 4; i++)
		{
			if (hasBothCoordsOutOfBounds[i])
			{
				DE_ASSERT(bothOutOfBoundsNdx < 0); // Only one sample can be out of bounds in both u and v.
				bothOutOfBoundsNdx = i;
			}
		}
		if (bothOutOfBoundsNdx != -1)
		{
			sampleRes[bothOutOfBoundsNdx] = 0.0f;
			for (int i = 0; i < 4; i++)
				if (i != bothOutOfBoundsNdx)
					sampleRes[bothOutOfBoundsNdx] += sampleRes[i];

			sampleRes[bothOutOfBoundsNdx] = sampleRes[bothOutOfBoundsNdx] * (1.0f/3.0f);
		}
	}

	// Interpolate.

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	return (sampleRes[0]*(1.0f-a)*(1.0f-b)) +
		   (sampleRes[1]*(     a)*(1.0f-b)) +
		   (sampleRes[2]*(1.0f-a)*(     b)) +
		   (sampleRes[3]*(     a)*(     b));
}